

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O2

int getpart(char **outbuf,size_t *outlen,char *main,char *sub,FILE *stream)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  byte *src_buf;
  size_t sVar7;
  byte *pbVar8;
  size_t sVar9;
  ulong uVar10;
  bool bVar11;
  int local_1fc;
  int local_1f4;
  size_t outalloc;
  char *local_1d8;
  char *local_1d0;
  char ptag [80];
  char csub [80];
  char cmain [80];
  char patt [80];
  char couter [80];
  
  outalloc = 0x100;
  *outlen = 0;
  pcVar6 = (char *)(*Curl_cmalloc)(0x100);
  *outbuf = pcVar6;
  if (pcVar6 == (char *)0x0) {
    return -1;
  }
  src_buf = (byte *)0x0;
  *pcVar6 = '\0';
  patt[0] = '\0';
  ptag[0] = '\0';
  csub[0] = '\0';
  cmain[0] = '\0';
  couter[0] = '\0';
  bVar2 = true;
  sVar9 = 0;
  local_1f4 = 0;
  local_1fc = 0;
  local_1d8 = sub;
  local_1d0 = main;
LAB_00103c7a:
  if (src_buf == (byte *)0x0) {
    sVar9 = 0x80;
    src_buf = (byte *)(*Curl_cmalloc)(0x80);
    if (src_buf != (byte *)0x0) goto LAB_00103c9c;
    src_buf = (byte *)0x0;
  }
  else {
LAB_00103c9c:
    uVar10 = 0;
    pbVar8 = src_buf;
    do {
      src_buf = pbVar8;
      do {
        iVar4 = curlx_uztosi(sVar9 - uVar10);
        pcVar6 = fgets((char *)(src_buf + uVar10),iVar4,(FILE *)stream);
        if (pcVar6 == (char *)0x0) {
          pbVar8 = src_buf;
          if (uVar10 != 0) goto LAB_00103d0b;
          bVar2 = true;
          iVar4 = 1;
          goto LAB_00104034;
        }
        sVar7 = strlen((char *)(src_buf + uVar10));
        uVar10 = uVar10 + sVar7;
        pbVar8 = src_buf;
        if (src_buf[uVar10 - 1] == 10) goto LAB_00103d0b;
      } while (uVar10 < sVar9 - 1);
      sVar9 = sVar9 * 2;
      pbVar8 = (byte *)(*Curl_crealloc)(src_buf,sVar9);
    } while (pbVar8 != (byte *)0x0);
  }
  goto LAB_0010402f;
  while (iVar4 = Curl_isspace((uint)*pbVar1), iVar4 != 0) {
LAB_00103d0b:
    pbVar1 = pbVar8;
    pbVar8 = pbVar1 + 1;
    if (*pbVar1 == 0) goto LAB_00103d2c;
  }
  if (*pbVar1 == 0x3c) {
    bVar3 = *pbVar8;
    if (bVar3 != 0x2f) {
      if (!bVar2) goto LAB_00103d37;
      for (sVar7 = 0;
          ((bVar3 != 0 && (iVar4 = Curl_isspace((uint)bVar3), iVar4 == 0)) &&
          (pbVar8[sVar7] != 0x3e)); sVar7 = sVar7 + 1) {
        bVar3 = pbVar1[sVar7 + 2];
      }
      if (0x4f < (long)sVar7) {
LAB_00104062:
        bVar2 = false;
        iVar4 = -2;
        goto LAB_00104034;
      }
      memcpy(ptag,pbVar8,sVar7);
      ptag[sVar7] = '\0';
      if ((ptag[0] == '!') || (ptag[0] == '?')) goto LAB_00103f88;
      pbVar8 = pbVar8 + sVar7;
      while ((*pbVar8 != 0 && (iVar4 = Curl_isspace((uint)*pbVar8), iVar4 != 0))) {
        pbVar8 = pbVar8 + 1;
      }
      for (sVar7 = 0; (pbVar8[sVar7] != 0 && (pbVar8[sVar7] != 0x3e)); sVar7 = sVar7 + 1) {
      }
      if (0x4f < (long)sVar7) goto LAB_00104062;
      memcpy(patt,pbVar8,sVar7);
      patt[sVar7] = '\0';
      if (local_1fc == 0) {
        pcVar6 = couter;
        local_1fc = 1;
      }
      else {
        if (local_1fc == 2) {
          strcpy(csub,ptag);
          iVar4 = strcmp(cmain,local_1d0);
          bVar2 = true;
          local_1fc = 3;
          if (iVar4 == 0) {
            iVar4 = strcmp(csub,local_1d8);
            local_1fc = 3;
            if (iVar4 == 0) {
              pcVar6 = strstr(patt,"base64=");
              if (pcVar6 != (char *)0x0) {
                local_1f4 = 1;
              }
              bVar2 = false;
              local_1fc = 3;
            }
          }
          goto LAB_00103c7a;
        }
        bVar11 = local_1fc != 1;
        local_1fc = 3;
        if (bVar11) goto LAB_00103d2c;
        pcVar6 = cmain;
        local_1fc = 2;
      }
      strcpy(pcVar6,ptag);
LAB_00103f88:
      bVar2 = true;
      goto LAB_00103c7a;
    }
    sVar7 = 0;
    for (pbVar8 = pbVar1 + 2;
        ((*pbVar8 != 0 && (iVar4 = Curl_isspace((uint)*pbVar8), iVar4 == 0)) && (*pbVar8 != 0x3e));
        pbVar8 = pbVar8 + 1) {
      sVar7 = sVar7 + 1;
    }
    if (0x4f < (long)sVar7) goto LAB_00104062;
    memcpy(ptag,pbVar1 + 2,sVar7);
    ptag[sVar7] = '\0';
    if (local_1fc == 1) {
      iVar4 = strcmp(couter,ptag);
      local_1fc = 1;
      if (iVar4 == 0) {
        couter[0] = '\0';
        local_1fc = 0;
        if (!bVar2) {
          bVar2 = true;
          iVar4 = 0;
LAB_00104034:
          (*Curl_cfree)(src_buf);
          if (!bVar2) {
            (*Curl_cfree)(*outbuf);
            *outbuf = (char *)0x0;
            *outlen = 0;
            return iVar4;
          }
          return 0;
        }
        goto LAB_00103c7a;
      }
    }
    else if (local_1fc == 2) {
      iVar4 = strcmp(cmain,ptag);
      local_1fc = 2;
      if (iVar4 == 0) {
        cmain[0] = '\0';
        local_1fc = 1;
LAB_00103f19:
        if (!bVar2) {
          iVar4 = 0;
          bVar2 = true;
          if ((local_1f4 != 0) && (iVar5 = decodedata(outbuf,outlen), iVar5 != 0)) {
            return -1;
          }
          goto LAB_00104034;
        }
        goto LAB_00103c7a;
      }
    }
    else if (local_1fc == 3) {
      iVar4 = strcmp(csub,ptag);
      local_1fc = 3;
      if (iVar4 == 0) {
        csub[0] = '\0';
        local_1fc = 2;
        goto LAB_00103f19;
      }
    }
  }
LAB_00103d2c:
  if (bVar2) goto LAB_00103c7a;
LAB_00103d37:
  iVar4 = appenddata(outbuf,outlen,&outalloc,(char *)src_buf,local_1f4);
  if (iVar4 != 0) {
LAB_0010402f:
    bVar2 = false;
    iVar4 = -1;
    goto LAB_00104034;
  }
  goto LAB_00103c7a;
}

Assistant:

int getpart(char **outbuf, size_t *outlen,
            const char *main, const char *sub, FILE *stream)
{
# define MAX_TAG_LEN 79
  char couter[MAX_TAG_LEN + 1]; /* current outermost section */
  char cmain[MAX_TAG_LEN + 1];  /* current main section */
  char csub[MAX_TAG_LEN + 1];   /* current sub section */
  char ptag[MAX_TAG_LEN + 1];   /* potential tag */
  char patt[MAX_TAG_LEN + 1];   /* potential attributes */
  char *buffer = NULL;
  char *ptr;
  char *end;
  union {
    ssize_t sig;
     size_t uns;
  } len;
  size_t bufsize = 0;
  size_t outalloc = 256;
  int in_wanted_part = 0;
  int base64 = 0;
  int error;

  enum {
    STATE_OUTSIDE = 0,
    STATE_OUTER   = 1,
    STATE_INMAIN  = 2,
    STATE_INSUB   = 3,
    STATE_ILLEGAL = 4
  } state = STATE_OUTSIDE;

  *outlen = 0;
  *outbuf = malloc(outalloc);
  if(!*outbuf)
    return GPE_OUT_OF_MEMORY;
  *(*outbuf) = '\0';

  couter[0] = cmain[0] = csub[0] = ptag[0] = patt[0] = '\0';

  while((error = readline(&buffer, &bufsize, stream)) == GPE_OK) {

    ptr = buffer;
    EAT_SPACE(ptr);

    if('<' != *ptr) {
      if(in_wanted_part) {
        show(("=> %s", buffer));
        error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
        if(error)
          break;
      }
      continue;
    }

    ptr++;

    if('/' == *ptr) {
      /*
      ** closing section tag
      */

      ptr++;
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      if((STATE_INSUB == state) && !strcmp(csub, ptag)) {
        /* end of current sub section */
        state = STATE_INMAIN;
        csub[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_INMAIN == state) && !strcmp(cmain, ptag)) {
        /* end of current main section */
        state = STATE_OUTER;
        cmain[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_OUTER == state) && !strcmp(couter, ptag)) {
        /* end of outermost file section */
        state = STATE_OUTSIDE;
        couter[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }

    }
    else if(!in_wanted_part) {
      /*
      ** opening section tag
      */

      /* get potential tag */
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      /* ignore comments, doctypes and xml declarations */
      if(('!' == ptag[0]) || ('?' == ptag[0])) {
        show(("* ignoring (%s)", buffer));
        continue;
      }

      /* get all potential attributes */
      ptr = end;
      EAT_SPACE(ptr);
      end = ptr;
      while(*end && ('>' != *end))
        end++;
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(patt, ptr, len.uns);
      patt[len.uns] = '\0';

      if(STATE_OUTSIDE == state) {
        /* outermost element (<testcase>) */
        strcpy(couter, ptag);
        state = STATE_OUTER;
        continue;
      }
      else if(STATE_OUTER == state) {
        /* start of a main section */
        strcpy(cmain, ptag);
        state = STATE_INMAIN;
        continue;
      }
      else if(STATE_INMAIN == state) {
        /* start of a sub section */
        strcpy(csub, ptag);
        state = STATE_INSUB;
        if(!strcmp(cmain, main) && !strcmp(csub, sub)) {
          /* start of wanted part */
          in_wanted_part = 1;
          if(strstr(patt, "base64="))
              /* bit rough test, but "mostly" functional, */
              /* treat wanted part data as base64 encoded */
              base64 = 1;
        }
        continue;
      }

    }

    if(in_wanted_part) {
      show(("=> %s", buffer));
      error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
      if(error)
        break;
    }

  } /* while */

  free(buffer);

  if(error != GPE_OK) {
    if(error == GPE_END_OF_FILE)
      error = GPE_OK;
    else {
      free(*outbuf);
      *outbuf = NULL;
      *outlen = 0;
    }
  }

  return error;
}